

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O0

vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
* __thiscall
ArcflowSol::remove_excess
          (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           *__return_storage_ptr__,ArcflowSol *this,
          vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *sol,vector<int,_std::allocator<int>_> *_dem)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *this_00;
  reference __k;
  int *piVar3;
  reference ppVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference ppVar7;
  iterator __first;
  iterator __last;
  mapped_type *pmVar8;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_280;
  reference local_260;
  pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int> *kvpair_3
  ;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  *__range1_2;
  pattern_pair *pp;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *__range1_1;
  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  mp;
  int type_2;
  pair<const_int,_int> *kvpair_2;
  iterator __end3_3;
  iterator __begin3_3;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3_3;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_1a8;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_1a0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_198;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_180;
  int local_160;
  int local_15c;
  reference ppStack_158;
  int type_1;
  pair<const_int,_int> *kvpair_1;
  iterator __end3_2;
  iterator __begin3_2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3_2;
  reference piStack_130;
  int f;
  int *ind;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  int type;
  pair<const_int,_int> *kvpair;
  iterator __end3;
  iterator __begin3;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3;
  undefined1 local_e0 [4];
  int rep;
  vector<int,_std::allocator<int>_> rm;
  int *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> count;
  pattern_int *pat;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range1;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  tmp;
  vector<int,_std::allocator<int>_> *dem;
  vector<int,_std::allocator<int>_> *_dem_local;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *sol_local;
  ArcflowSol *this_local;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *finalsol;
  
  tmp.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_dem;
  std::
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::vector((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::begin(sol);
  pat = (pattern_int *)
        std::
        vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::end(sol);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<int,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                                     *)&pat), bVar1) {
    count._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_std::pair<int,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ::operator*(&__end1);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &__range2);
    this_00 = (vector<int,_std::allocator<int>_> *)
              (count._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
    it = (int *)std::vector<int,_std::allocator<int>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&it), bVar1) {
      __k = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator*(&__end2);
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&__range2,__k);
      *pmVar8 = *pmVar8 + 1;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_e0);
    __range3._4_4_ = *(int *)count._M_t._M_impl.super__Rb_tree_header._M_node_count;
    while (0 < __range3._4_4_) {
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_e0);
      __end3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               begin((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &__range2);
      kvpair = (pair<const_int,_int> *)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&__range2);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&kvpair), bVar1) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*(&__end3);
        pvVar5 = std::vector<Item,_std::allocator<Item>_>::operator[]
                           (&(this->inst).items,(long)ppVar4->first);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            tmp.
                            super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)pvVar5->type);
        piVar3 = std::min<int>(&ppVar4->second,pvVar6);
        ppVar4->second = *piVar3;
        if (ppVar4->second == 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_e0,&ppVar4->first);
        }
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&__end3);
      }
      __end3_1 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_e0);
      ind = (int *)std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_e0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&ind), bVar1) {
        piStack_130 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end3_1);
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::erase
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   &__range2,piStack_130);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_1);
      }
      __range3_2._4_4_ = __range3._4_4_;
      __end3_2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 begin((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&__range2);
      kvpair_1 = (pair<const_int,_int> *)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 end((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &__range2);
      while (bVar1 = std::operator!=(&__end3_2,(_Self *)&kvpair_1), bVar1) {
        ppStack_158 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*(&__end3_2);
        pvVar5 = std::vector<Item,_std::allocator<Item>_>::operator[]
                           (&(this->inst).items,(long)ppStack_158->first);
        local_15c = pvVar5->type;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            tmp.
                            super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_15c);
        local_160 = *pvVar6 / ppStack_158->second;
        piVar3 = std::min<int>((int *)((long)&__range3_2 + 4),&local_160);
        __range3_2._4_4_ = *piVar3;
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&__end3_2);
      }
      __range3._4_4_ = __range3._4_4_ - __range3_2._4_4_;
      local_1a0._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &__range2);
      local_1a8._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &__range2);
      std::allocator<std::pair<int,_int>_>::allocator
                ((allocator<std::pair<int,_int>_> *)((long)&__range3_3 + 7));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,int>>,void>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_198,
                 local_1a0,local_1a8,(allocator<std::pair<int,_int>_> *)((long)&__range3_3 + 7));
      std::make_pair<int&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                (&local_180,(int *)((long)&__range3_2 + 4),&local_198);
      std::
      vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::push_back((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                   *)&__range1,&local_180);
      std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
      ~pair(&local_180);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_198);
      std::allocator<std::pair<int,_int>_>::~allocator
                ((allocator<std::pair<int,_int>_> *)((long)&__range3_3 + 7));
      __end3_3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 begin((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&__range2);
      kvpair_2 = (pair<const_int,_int> *)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 end((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &__range2);
      while (bVar1 = std::operator!=(&__end3_3,(_Self *)&kvpair_2), bVar1) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*(&__end3_3);
        pvVar5 = std::vector<Item,_std::allocator<Item>_>::operator[]
                           (&(this->inst).items,(long)ppVar4->first);
        mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = pvVar5->type;
        iVar2 = __range3_2._4_4_ * ppVar4->second;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            tmp.
                            super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        *pvVar6 = *pvVar6 - iVar2;
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&__end3_3);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &__range2);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  ::map((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
         *)&__range1_1);
  __end1_1 = std::
             vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::begin((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)&__range1);
  pp = (pattern_pair *)
       std::
       vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
       ::end((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
              *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                             *)&pp), bVar1) {
    ppVar7 = __gnu_cxx::
             __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
             ::operator*(&__end1_1);
    __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        (&ppVar7->second);
    __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                       (&ppVar7->second);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__last._M_current);
    iVar2 = ppVar7->first;
    pmVar8 = std::
             map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
             ::operator[]((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                           *)&__range1_1,&ppVar7->second);
    *pmVar8 = iVar2 + *pmVar8;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::vector(__return_storage_ptr__);
  __end1_2 = std::
             map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
             ::begin((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                      *)&__range1_1);
  kvpair_3 = (pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>
              *)std::
                map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                ::end((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                       *)&__range1_1);
  while (bVar1 = std::operator!=(&__end1_2,(_Self *)&kvpair_3), bVar1) {
    local_260 = std::
                _Rb_tree_iterator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>
                ::operator*(&__end1_2);
    std::
    make_pair<int_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&>
              (&local_280,&local_260->second,&local_260->first);
    std::
    vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::push_back(__return_storage_ptr__,&local_280);
    std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::~pair
              (&local_280);
    std::
    _Rb_tree_iterator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>
    ::operator++(&__end1_2);
  }
  std::
  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  ::~map((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
          *)&__range1_1);
  std::
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<pattern_pair> ArcflowSol::remove_excess(const std::vector<pattern_int> &sol,
													std::vector<int> *_dem) const {
	std::vector<int> &dem = *_dem;
	std::vector<pattern_pair> tmp;
	for (const pattern_int &pat : sol) {
		std::map<int, int> count;
		for (const int &it : pat.second) {
			count[it] += 1;
		}
		std::vector<int> rm;
		int rep = pat.first;
		while (rep > 0) {
			rm.clear();
			for (auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				kvpair.second = std::min(kvpair.second, dem[type]);
				if (kvpair.second == 0) {
					rm.push_back(kvpair.first);
				}
			}
			for (const int &ind : rm) {
				count.erase(ind);
			}

			int f = rep;
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				f = std::min(f, dem[type] / kvpair.second);
			}
			rep -= f;

			tmp.push_back(MP(f, std::vector<int_pair>(all(count))));
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				dem[type] -= f * kvpair.second;
			}
		}
	}

	std::map<std::vector<int_pair>, int> mp;
	for (pattern_pair &pp : tmp) {
		sort(all(pp.second));
		mp[pp.second] += pp.first;
	}

	std::vector<pattern_pair> finalsol;
	for (const auto &kvpair : mp) {
		finalsol.push_back(MP(kvpair.second, kvpair.first));
	}
	return finalsol;
}